

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O1

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  int iVar38;
  undefined4 uVar39;
  uint extraout_EAX;
  ulong uVar40;
  long lVar41;
  byte bVar42;
  int iVar43;
  int iVar44;
  ulong uVar45;
  long lVar46;
  uint uVar47;
  int extraout_EDX;
  uint uVar48;
  int extraout_EDX_00;
  int extraout_EDX_01;
  secp256k1_modinv32_signed30 *a;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar49;
  long lVar50;
  secp256k1_modinv32_signed30 *b;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  uint uVar57;
  secp256k1_modinv32_signed30 *psVar58;
  int *piVar59;
  secp256k1_fe *psVar60;
  uint uVar61;
  uint8_t *puVar62;
  secp256k1_modinv32_modinfo *psVar63;
  long lVar64;
  secp256k1_fe *psVar65;
  ulong uVar66;
  secp256k1_fe *psVar67;
  secp256k1_fe *a_00;
  secp256k1_modinv32_signed30 *psVar68;
  secp256k1_modinv32_signed30 *psVar69;
  long lVar70;
  ulong uVar71;
  secp256k1_fe *r;
  secp256k1_fe *r_00;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  uint uVar83;
  int *piVar84;
  uint uVar85;
  secp256k1_modinv32_modinfo *modinfo_00;
  secp256k1_modinv32_modinfo *psVar86;
  secp256k1_modinv32_signed30 *psVar87;
  code *pcVar88;
  uint uVar89;
  secp256k1_modinv32_signed30 *psVar90;
  ulong uVar91;
  secp256k1_modinv32_signed30 *psVar92;
  uint uVar93;
  secp256k1_modinv32_signed30 *psVar94;
  uint uVar95;
  uint uVar96;
  ulong uVar97;
  code *pcVar98;
  code *pcVar99;
  bool bVar100;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar101 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  secp256k1_modinv32_signed30 e;
  uchar auStack_570 [40];
  secp256k1_fe *psStack_548;
  code *pcStack_540;
  ulong uStack_538;
  secp256k1_fe *psStack_530;
  code *pcStack_528;
  secp256k1_fe *psStack_520;
  code *pcStack_510;
  undefined1 auStack_508 [32];
  secp256k1_fe sStack_4e8;
  undefined1 auStack_4b8 [16];
  undefined1 auStack_4a0 [48];
  undefined8 uStack_470;
  secp256k1_fe *psStack_468;
  undefined8 uStack_460;
  code *pcStack_458;
  secp256k1_fe sStack_450;
  secp256k1_fe sStack_420;
  secp256k1_fe sStack_3f0;
  ulong uStack_3b8;
  ulong uStack_3b0;
  ulong uStack_3a8;
  secp256k1_modinv32_signed30 *psStack_3a0;
  ulong uStack_398;
  code *pcStack_390;
  uint uStack_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  secp256k1_modinv32_signed30 *psStack_370;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint uStack_358;
  int32_t iStack_354;
  secp256k1_modinv32_signed30 *psStack_350;
  secp256k1_modinv32_signed30 *psStack_348;
  secp256k1_modinv32_signed30 *psStack_340;
  secp256k1_modinv32_signed30 *psStack_338;
  secp256k1_modinv32_signed30 *psStack_330;
  code *pcStack_328;
  long lStack_318;
  long lStack_310;
  int *piStack_308;
  secp256k1_modinv32_modinfo *psStack_300;
  ulong uStack_2f8;
  ulong uStack_2e8;
  code *pcStack_2e0;
  secp256k1_modinv32_signed30 *psStack_2d8;
  int *piStack_2c8;
  secp256k1_modinv32_modinfo *psStack_2c0;
  ulong uStack_2b8;
  ulong uStack_2a8;
  code *pcStack_2a0;
  secp256k1_modinv32_signed30 sStack_298;
  secp256k1_modinv32_signed30 sStack_274;
  secp256k1_modinv32_signed30 *psStack_250;
  secp256k1_modinv32_signed30 *psStack_248;
  secp256k1_modinv32_modinfo *psStack_238;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  secp256k1_modinv32_signed30 sStack_220;
  secp256k1_modinv32_trans2x2 sStack_1f0;
  secp256k1_modinv32_signed30 sStack_1e0;
  secp256k1_modinv32_signed30 *psStack_1b0;
  long lStack_1a8;
  secp256k1_modinv32_signed30 sStack_1a0;
  secp256k1_modinv32_signed30 sStack_170;
  secp256k1_modinv32_signed30 *psStack_148;
  secp256k1_modinv32_modinfo *psStack_140;
  secp256k1_modinv32_signed30 *psStack_138;
  secp256k1_modinv32_signed30 *psStack_130;
  secp256k1_modinv32_modinfo *psStack_128;
  code *pcStack_120;
  uint local_10c;
  secp256k1_modinv32_trans2x2 local_108;
  secp256k1_modinv32_signed30 local_f8;
  uint uStack_cc;
  secp256k1_modinv32_signed30 local_c8;
  secp256k1_modinv32_signed30 *local_a0;
  secp256k1_modinv32_modinfo *local_98;
  secp256k1_modinv32_signed30 *local_90;
  secp256k1_modinv32_signed30 local_88;
  secp256k1_modinv32_signed30 local_58;
  
  psVar94 = (secp256k1_modinv32_signed30 *)0x0;
  local_88.v[8] = 0;
  local_88.v[4] = 0;
  local_88.v[5] = 0;
  local_88.v[6] = 0;
  local_88.v[7] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_58.v[2] = 0;
  local_58.v[3] = 0;
  local_58.v[8] = 0;
  local_58.v[4] = 0;
  local_58.v[5] = 0;
  local_58.v[6] = 0;
  local_58.v[7] = 0;
  local_58.v[0] = 1;
  local_58.v[1] = 0;
  local_f8.v[8] = (modinfo->modulus).v[8];
  local_f8.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_f8.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_f8.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_f8.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_c8.v[8] = x->v[8];
  local_c8.v._0_8_ = *(undefined8 *)x->v;
  local_c8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_c8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_c8.v._24_8_ = *(undefined8 *)(x->v + 6);
  modinfo_00 = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar58 = (secp256k1_modinv32_signed30 *)0x9;
  puVar62 = secp256k1_modinv32_inv256;
  local_a0 = x;
  local_98 = modinfo;
  do {
    psVar86 = local_98;
    local_10c = (uint)psVar94;
    psVar63 = (secp256k1_modinv32_modinfo *)(local_f8.v._0_8_ & 0xffffffff);
    psVar68 = (secp256k1_modinv32_signed30 *)(local_c8.v._0_8_ & 0xffffffff);
    uVar83 = 1;
    psVar69 = (secp256k1_modinv32_signed30 *)0x0;
    iVar38 = 0x1e;
    uVar47 = 0;
    psVar90 = (secp256k1_modinv32_signed30 *)0x1;
    uVar48 = local_f8.v[0];
    uVar72 = local_c8.v[0];
    while( true ) {
      uVar56 = -1 << ((byte)iVar38 & 0x1f) | uVar72;
      psVar92 = (secp256k1_modinv32_signed30 *)(ulong)uVar56;
      iVar43 = 0;
      if (uVar56 != 0) {
        for (; (uVar56 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
        }
      }
      bVar42 = (byte)iVar43;
      uVar72 = uVar72 >> (bVar42 & 0x1f);
      uVar89 = (int)psVar90 << (bVar42 & 0x1f);
      psVar90 = (secp256k1_modinv32_signed30 *)(ulong)uVar89;
      uVar47 = uVar47 << (bVar42 & 0x1f);
      uVar56 = (int)modinfo_00 - iVar43;
      modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)uVar56;
      iVar38 = iVar38 - iVar43;
      iVar43 = (int)psVar69;
      local_90 = psVar58;
      if (iVar38 == 0) break;
      if ((uVar48 & 1) == 0) {
        pcStack_120 = (code *)0x1569c4;
        secp256k1_modinv32_var_cold_7();
LAB_001569c4:
        pcStack_120 = (code *)0x1569c9;
        secp256k1_modinv32_var_cold_6();
LAB_001569c9:
        pcStack_120 = (code *)0x1569ce;
        secp256k1_modinv32_var_cold_1();
LAB_001569ce:
        pcStack_120 = (code *)0x1569d3;
        secp256k1_modinv32_var_cold_2();
LAB_001569d3:
        pcStack_120 = (code *)0x1569d8;
        secp256k1_modinv32_var_cold_5();
LAB_001569d8:
        pcStack_120 = (code *)0x1569dd;
        secp256k1_modinv32_var_cold_4();
        goto LAB_001569dd;
      }
      if ((uVar72 & 1) == 0) goto LAB_001569c4;
      uVar57 = uVar47 * local_c8.v[0] + uVar89 * local_f8.v[0];
      psVar92 = (secp256k1_modinv32_signed30 *)(ulong)uVar57;
      bVar42 = 0x1e - (char)iVar38;
      uVar93 = uVar48 << (bVar42 & 0x1f);
      psVar94 = (secp256k1_modinv32_signed30 *)(ulong)uVar93;
      if (uVar57 != uVar93) goto LAB_001569c9;
      uVar93 = uVar83 * local_c8.v[0] + iVar43 * local_f8.v[0];
      psVar94 = (secp256k1_modinv32_signed30 *)(ulong)uVar93;
      uVar57 = uVar72 << (bVar42 & 0x1f);
      psVar92 = (secp256k1_modinv32_signed30 *)(ulong)uVar57;
      if (uVar93 != uVar57) goto LAB_001569ce;
      if (uVar56 - 0x2f0 < 0xfffffa21) goto LAB_001569d3;
      psVar94 = psVar69;
      if ((int)uVar56 < 0) {
        modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)-uVar56;
        uVar56 = -uVar48;
        uVar57 = -uVar47;
        psVar90 = psVar69;
        psVar94 = (secp256k1_modinv32_signed30 *)(ulong)-uVar89;
        uVar48 = uVar72;
        uVar72 = uVar56;
        uVar47 = uVar83;
        uVar83 = uVar57;
      }
      psVar92 = (secp256k1_modinv32_signed30 *)(ulong)uVar83;
      iVar43 = (int)modinfo_00 + 1;
      if (iVar38 <= iVar43) {
        iVar43 = iVar38;
      }
      if (iVar43 - 0x1fU < 0xffffffe2) goto LAB_001569d8;
      uVar89 = (uint)(0xff << (-(char)iVar43 & 0x1fU)) >> (-(char)iVar43 & 0x1fU);
      modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar89;
      uVar56 = secp256k1_modinv32_inv256[uVar48 >> 1 & 0x7f] * uVar72 & uVar89;
      uVar72 = uVar72 + uVar56 * uVar48;
      psVar69 = (secp256k1_modinv32_signed30 *)(ulong)(uVar56 * (int)psVar90 + (int)psVar94);
      uVar83 = uVar56 * uVar47 + uVar83;
      if ((uVar72 & uVar89) != 0) {
LAB_001569dd:
        pcStack_120 = (code *)0x1569e2;
        secp256k1_modinv32_var_cold_3();
        goto LAB_001569e2;
      }
    }
    local_108.u = uVar89;
    local_108.v = uVar47;
    local_108.q = iVar43;
    local_108.r = uVar83;
    if ((long)(int)uVar83 * (long)(int)uVar89 - (long)iVar43 * (long)(int)uVar47 != 0x40000000) {
LAB_001569e2:
      pcStack_120 = (code *)0x1569e7;
      secp256k1_modinv32_var_cold_8();
      psVar58 = psVar92;
      psVar86 = modinfo;
LAB_001569e7:
      pcStack_120 = (code *)0x1569ec;
      secp256k1_modinv32_var_cold_19();
LAB_001569ec:
      pcStack_120 = (code *)0x1569f1;
      secp256k1_modinv32_var_cold_18();
LAB_001569f1:
      pcStack_120 = (code *)0x1569f6;
      secp256k1_modinv32_var_cold_17();
LAB_001569f6:
      pcStack_120 = (code *)0x1569fb;
      secp256k1_modinv32_var_cold_16();
LAB_001569fb:
      pcStack_120 = (code *)0x156a00;
      secp256k1_modinv32_var_cold_13();
LAB_00156a00:
      pcStack_120 = (code *)0x156a05;
      secp256k1_modinv32_var_cold_12();
LAB_00156a05:
      pcStack_120 = (code *)0x156a0a;
      secp256k1_modinv32_var_cold_11();
LAB_00156a0a:
      pcStack_120 = (code *)0x156a0f;
      secp256k1_modinv32_var_cold_10();
LAB_00156a0f:
      pcStack_120 = (code *)0x156a14;
      secp256k1_modinv32_var_cold_9();
      goto LAB_00156a14;
    }
    pcStack_120 = (code *)0x156729;
    secp256k1_modinv32_update_de_30(&local_88,&local_58,&local_108,local_98);
    psVar58 = local_90;
    psVar90 = &local_f8;
    iVar43 = (int)local_90;
    psVar63 = (secp256k1_modinv32_modinfo *)((ulong)local_90 & 0xffffffff);
    pcStack_120 = (code *)0x156748;
    psVar68 = psVar90;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,iVar43,&psVar86->modulus,-1);
    if (iVar38 < 1) goto LAB_001569e7;
    psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
    pcStack_120 = (code *)0x156762;
    psVar68 = psVar90;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,iVar43,&psVar86->modulus,1);
    if (0 < iVar38) goto LAB_001569ec;
    psVar94 = &local_c8;
    psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
    pcStack_120 = (code *)0x156781;
    psVar68 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,iVar43,&psVar86->modulus,-1);
    if (iVar38 < 1) goto LAB_001569f1;
    psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
    pcStack_120 = (code *)0x15679b;
    psVar68 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,iVar43,&psVar86->modulus,1);
    if (-1 < iVar38) goto LAB_001569f6;
    pcStack_120 = (code *)0x1567b5;
    secp256k1_modinv32_update_fg_30_var(iVar43,psVar90,psVar94,&local_108);
    uVar83 = local_10c;
    psVar94 = (secp256k1_modinv32_signed30 *)(ulong)local_10c;
    if (local_c8.v[0] != 0) {
LAB_001567c5:
      uVar48 = local_f8.v[(long)iVar43 + -1];
      uVar72 = (&uStack_cc)[iVar43];
      iVar38 = iVar43 + -2;
      uVar47 = (int)uVar48 >> 0x1f ^ uVar48 | iVar38 >> 0x1f;
      psVar68 = (secp256k1_modinv32_signed30 *)(ulong)uVar47;
      uVar47 = (int)uVar72 >> 0x1f ^ uVar72 | uVar47;
      psVar63 = (secp256k1_modinv32_modinfo *)(ulong)uVar47;
      if (uVar47 == 0) {
        psVar58 = (secp256k1_modinv32_signed30 *)(ulong)(iVar43 - 1);
        local_f8.v[iVar38] = local_f8.v[iVar38] | uVar48 << 0x1e;
        local_c8.v[iVar38] = local_c8.v[iVar38] | uVar72 << 0x1e;
      }
      if (0x17 < (int)local_10c) goto LAB_001569fb;
      iVar43 = (int)psVar58;
      psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
      pcStack_120 = (code *)0x15681b;
      psVar68 = psVar90;
      iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,iVar43,&psVar86->modulus,-1);
      if (iVar38 < 1) goto LAB_00156a00;
      psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
      pcStack_120 = (code *)0x156835;
      psVar68 = psVar90;
      iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,iVar43,&psVar86->modulus,1);
      if (0 < iVar38) goto LAB_00156a05;
      psVar90 = &local_c8;
      psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
      pcStack_120 = (code *)0x156854;
      psVar68 = psVar90;
      iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,iVar43,&psVar86->modulus,-1);
      if (iVar38 < 1) goto LAB_00156a0a;
      psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
      pcStack_120 = (code *)0x15686e;
      psVar68 = psVar90;
      iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,iVar43,&psVar86->modulus,1);
      if (iVar38 < 0) {
        psVar94 = (secp256k1_modinv32_signed30 *)(ulong)(uVar83 + 1);
        uVar48 = 1;
        goto LAB_001568a1;
      }
      goto LAB_00156a0f;
    }
    uVar48 = 0;
    if (1 < iVar43) {
      uVar97 = 1;
      do {
        uVar48 = uVar48 | local_c8.v[uVar97];
        uVar97 = uVar97 + 1;
      } while (((ulong)psVar58 & 0xffffffff) != uVar97);
      if (uVar48 != 0) goto LAB_001567c5;
      uVar48 = 0;
    }
LAB_001568a1:
    modinfo = psVar86;
  } while ((char)uVar48 != '\0');
  psVar68 = &local_c8;
  iVar43 = (int)psVar58;
  psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
  pcStack_120 = (code *)0x1568be;
  iVar38 = secp256k1_modinv32_mul_cmp_30(psVar68,iVar43,&SECP256K1_SIGNED30_ONE,0);
  if (iVar38 == 0) {
    pcStack_120 = (code *)0x1568de;
    iVar38 = secp256k1_modinv32_mul_cmp_30(&local_f8,iVar43,&SECP256K1_SIGNED30_ONE,-1);
    psVar94 = local_a0;
    if (iVar38 == 0) {
LAB_0015697c:
      pcStack_120 = (code *)0x156996;
      secp256k1_modinv32_normalize_30(&local_88,local_f8.v[(long)iVar43 + -1],psVar86);
      psVar94->v[8] = local_88.v[8];
      *(undefined8 *)(psVar94->v + 4) = local_88.v._16_8_;
      *(undefined8 *)(psVar94->v + 6) = local_88.v._24_8_;
      *(undefined8 *)psVar94->v = local_88.v._0_8_;
      *(undefined8 *)(psVar94->v + 2) = local_88.v._8_8_;
      return;
    }
    pcStack_120 = (code *)0x156903;
    iVar38 = secp256k1_modinv32_mul_cmp_30(&local_f8,iVar43,&SECP256K1_SIGNED30_ONE,1);
    if (iVar38 == 0) goto LAB_0015697c;
    psVar63 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_120 = (code *)0x15691d;
    psVar68 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar38 == 0) {
      psVar68 = &local_88;
      psVar63 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_120 = (code *)0x156940;
      iVar38 = secp256k1_modinv32_mul_cmp_30(psVar68,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar38 == 0) {
        pcStack_120 = (code *)0x15695c;
        iVar38 = secp256k1_modinv32_mul_cmp_30(&local_f8,iVar43,&psVar86->modulus,1);
        if (iVar38 == 0) goto LAB_0015697c;
        psVar68 = &local_f8;
        psVar63 = (secp256k1_modinv32_modinfo *)((ulong)psVar58 & 0xffffffff);
        pcStack_120 = (code *)0x156974;
        iVar38 = secp256k1_modinv32_mul_cmp_30(psVar68,iVar43,&psVar86->modulus,-1);
        if (iVar38 == 0) goto LAB_0015697c;
      }
    }
  }
  else {
LAB_00156a14:
    pcStack_120 = (code *)0x156a19;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_120 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_120 = (code *)secp256k1_modinv32_inv256;
  psStack_128 = psVar86;
  psStack_130 = psVar94;
  psStack_138 = psVar90;
  psStack_140 = modinfo_00;
  psStack_148 = psVar58;
  uVar83 = 0;
  sStack_1a0.v[8] = 0;
  sStack_1a0.v[4] = 0;
  sStack_1a0.v[5] = 0;
  sStack_1a0.v[6] = 0;
  sStack_1a0.v[7] = 0;
  sStack_1a0.v[0] = 0;
  sStack_1a0.v[1] = 0;
  sStack_1a0.v[2] = 0;
  sStack_1a0.v[3] = 0;
  sStack_170.v[2] = 0;
  sStack_170.v[3] = 0;
  sStack_170.v[8] = 0;
  sStack_170.v[4] = 0;
  sStack_170.v[5] = 0;
  sStack_170.v[6] = 0;
  sStack_170.v[7] = 0;
  sStack_170.v[0] = 1;
  sStack_170.v[1] = 0;
  sStack_220.v[8] = (psVar63->modulus).v[8];
  sStack_220.v._16_8_ = *(undefined8 *)((psVar63->modulus).v + 4);
  sStack_220.v._24_8_ = *(undefined8 *)((psVar63->modulus).v + 6);
  sStack_220.v._0_8_ = *(undefined8 *)(psVar63->modulus).v;
  sStack_220.v._8_8_ = *(undefined8 *)((psVar63->modulus).v + 2);
  sStack_1e0.v[8] = psVar68->v[8];
  sStack_1e0.v._0_8_ = *(undefined8 *)psVar68->v;
  sStack_1e0.v._8_8_ = *(undefined8 *)(psVar68->v + 2);
  psStack_1b0 = psVar68;
  sStack_1e0.v._16_8_ = *(undefined8 *)(psVar68->v + 4);
  sStack_1e0.v._24_8_ = *(undefined8 *)(psVar68->v + 6);
  uVar97 = 0xffffffff;
  psStack_238 = psVar63;
  do {
    lStack_1a8 = (long)sStack_220.v[0];
    uVar91 = (ulong)sStack_1e0.v[0];
    uVar45 = 0;
    psVar90 = (secp256k1_modinv32_signed30 *)0x1;
    uVar48 = 0;
    uVar56 = 0;
    uVar89 = 1;
    uVar72 = sStack_1e0.v[0];
    uVar47 = sStack_220.v[0];
    do {
      uVar57 = sStack_220.v[0];
      uStack_22c = uVar83;
      if ((uVar47 & 1) == 0) {
        psStack_248 = (secp256k1_modinv32_signed30 *)0x156ef4;
        secp256k1_modinv32_cold_17();
LAB_00156ef4:
        psStack_248 = (secp256k1_modinv32_signed30 *)0x156ef9;
        secp256k1_modinv32_cold_1();
LAB_00156ef9:
        psStack_248 = (secp256k1_modinv32_signed30 *)0x156efe;
        secp256k1_modinv32_cold_2();
        psVar86 = modinfo_00;
LAB_00156efe:
        psStack_248 = (secp256k1_modinv32_signed30 *)0x156f03;
        secp256k1_modinv32_cold_16();
        goto LAB_00156f03;
      }
      uVar75 = (uint)psVar90;
      uVar61 = uVar48 * sStack_1e0.v[0] + uVar75 * sStack_220.v[0];
      puVar62 = (uint8_t *)(ulong)uVar61;
      uVar93 = uVar47 << ((byte)uVar45 & 0x1f);
      psVar58 = (secp256k1_modinv32_signed30 *)(ulong)uVar93;
      if (uVar61 != uVar93) goto LAB_00156ef4;
      uVar61 = uVar89 * sStack_1e0.v[0] + uVar56 * sStack_220.v[0];
      puVar62 = (uint8_t *)(ulong)uVar61;
      uVar93 = uVar72 << ((byte)uVar45 & 0x1f);
      psVar58 = (secp256k1_modinv32_signed30 *)(ulong)uVar93;
      if (uVar61 != uVar93) goto LAB_00156ef9;
      uStack_224 = (int)(uint)uVar97 >> 0x1f;
      puVar62 = (uint8_t *)(ulong)uStack_224;
      uStack_228 = uVar72 & 1;
      uVar93 = -uStack_228;
      psVar94 = (secp256k1_modinv32_signed30 *)(ulong)uVar93;
      uVar61 = uStack_224 & uVar93;
      psVar58 = (secp256k1_modinv32_signed30 *)(ulong)uVar61;
      uVar95 = (uint)uVar97 ^ uVar61;
      uVar97 = (ulong)uVar95;
      psVar86 = (secp256k1_modinv32_modinfo *)(ulong)(uVar95 - 0x25b);
      if (uVar95 - 0x25b < 0xfffffb4d) goto LAB_00156efe;
      uVar97 = (ulong)(uVar95 - 1);
      uVar89 = uVar89 + ((uStack_224 ^ uVar48) - uStack_224 & uVar93);
      uVar48 = (uVar48 + (uVar89 & uVar61)) * 2;
      uVar56 = uVar56 + ((uStack_224 ^ uVar75) - uStack_224 & uVar93);
      uVar75 = (uVar75 + (uVar56 & uVar61)) * 2;
      psVar90 = (secp256k1_modinv32_signed30 *)(ulong)uVar75;
      uVar93 = ((uStack_224 ^ uVar47) - uStack_224 & uVar93) + uVar72;
      uVar72 = uVar93 >> 1;
      uVar93 = uVar93 & uVar61;
      modinfo_00 = (secp256k1_modinv32_modinfo *)(ulong)uVar93;
      uVar47 = uVar47 + uVar93;
      uVar93 = (int)uVar45 + 1;
      uVar45 = (ulong)uVar93;
    } while (uVar93 != 0x1e);
    psVar58 = (secp256k1_modinv32_signed30 *)(long)(int)uVar75;
    psVar94 = (secp256k1_modinv32_signed30 *)(long)(int)uVar89;
    puVar62 = (uint8_t *)(long)(int)uVar48;
    psVar86 = (secp256k1_modinv32_modinfo *)(long)(int)uVar56;
    uVar45 = (long)psVar58 * (long)psVar94 - (long)puVar62 * (long)psVar86;
    sStack_1f0.u = uVar75;
    sStack_1f0.v = uVar48;
    sStack_1f0.q = uVar56;
    sStack_1f0.r = uVar89;
    if (uVar45 != 0x40000000) {
LAB_00156f03:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f08;
      secp256k1_modinv32_cold_3();
LAB_00156f08:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f0d;
      secp256k1_modinv32_cold_15();
LAB_00156f0d:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f12;
      secp256k1_modinv32_cold_14();
LAB_00156f12:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f17;
      secp256k1_modinv32_cold_13();
LAB_00156f17:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f1c;
      secp256k1_modinv32_cold_12();
LAB_00156f1c:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f21;
      secp256k1_modinv32_cold_4();
LAB_00156f21:
      modinfo_00 = psVar86;
      uVar83 = (uint)uVar45;
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f26;
      secp256k1_modinv32_cold_5();
LAB_00156f26:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f2b;
      secp256k1_modinv32_cold_11();
LAB_00156f2b:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f30;
      secp256k1_modinv32_cold_10();
LAB_00156f30:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f35;
      secp256k1_modinv32_cold_9();
LAB_00156f35:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156f3a;
      secp256k1_modinv32_cold_8();
      goto LAB_00156f3a;
    }
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156c07;
    secp256k1_modinv32_update_de_30(&sStack_1a0,&sStack_170,&sStack_1f0,psStack_238);
    psVar90 = &sStack_220;
    uVar57 = 9;
    uVar45 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156c20;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,9,&psStack_238->modulus,-1);
    if (iVar38 < 1) goto LAB_00156f08;
    psVar90 = &sStack_220;
    uVar57 = 9;
    uVar45 = 1;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156c41;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,9,&psStack_238->modulus,1);
    if (0 < iVar38) goto LAB_00156f0d;
    psVar90 = &sStack_1e0;
    uVar57 = 9;
    uVar45 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156c62;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,9,&psStack_238->modulus,-1);
    if (iVar38 < 1) goto LAB_00156f12;
    psVar90 = &sStack_1e0;
    uVar57 = 9;
    uVar45 = 1;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156c83;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,9,&psStack_238->modulus,1);
    modinfo_00 = psStack_238;
    if (-1 < iVar38) goto LAB_00156f17;
    uVar45 = (long)psVar58 * lStack_1a8;
    uVar40 = (long)puVar62 * uVar91 + uVar45;
    if ((uVar40 & 0x3ffffffe) != 0) goto LAB_00156f1c;
    uVar91 = uVar91 * (long)psVar94 + lStack_1a8 * (long)psVar86;
    if ((uVar91 & 0x3fffffff) != 0) goto LAB_00156f21;
    uVar91 = (long)uVar91 >> 0x1e;
    lVar41 = (long)uVar40 >> 0x1e;
    lVar46 = 1;
    do {
      lVar41 = (long)sStack_1e0.v[lVar46] * (long)puVar62 +
               (long)sStack_220.v[lVar46] * (long)psVar58 + lVar41;
      lVar64 = (long)sStack_1e0.v[lVar46] * (long)psVar94 +
               (long)sStack_220.v[lVar46] * (long)psVar86 + uVar91;
      (&uStack_224)[lVar46] = (uint)lVar41 & 0x3fffffff;
      sStack_1e0.v[lVar46 + -1] = (uint)lVar64 & 0x3fffffff;
      lVar46 = lVar46 + 1;
      uVar91 = lVar64 >> 0x1e;
      lVar41 = lVar41 >> 0x1e;
    } while (lVar46 != 9);
    sStack_220.v[8] = (int32_t)lVar41;
    sStack_1e0.v[8] = (int32_t)uVar91;
    psVar58 = &sStack_220;
    uVar57 = 9;
    uVar83 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156d57;
    psVar90 = psVar58;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar58,9,&psStack_238->modulus,-1);
    if (iVar38 < 1) goto LAB_00156f26;
    uVar57 = 9;
    uVar83 = 1;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156d74;
    psVar90 = psVar58;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar58,9,&modinfo_00->modulus,1);
    if (0 < iVar38) goto LAB_00156f2b;
    psVar58 = &sStack_1e0;
    uVar57 = 9;
    uVar83 = 0xffffffff;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156d96;
    psVar90 = psVar58;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar58,9,&modinfo_00->modulus,-1);
    if (iVar38 < 1) goto LAB_00156f30;
    uVar57 = 9;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156db3;
    psVar90 = psVar58;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar58,9,&modinfo_00->modulus,1);
    uVar83 = uStack_22c;
    if (-1 < iVar38) goto LAB_00156f35;
    uVar83 = uStack_22c + 1;
  } while (uVar83 != 0x14);
  psVar90 = &sStack_1e0;
  uVar57 = 9;
  uVar83 = 0;
  psStack_248 = (secp256k1_modinv32_signed30 *)0x156de2;
  iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar38 == 0) {
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156e05;
    iVar38 = secp256k1_modinv32_mul_cmp_30(&sStack_220,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar94 = psStack_1b0;
    if (iVar38 == 0) {
LAB_00156eaf:
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156ec6;
      secp256k1_modinv32_normalize_30(&sStack_1a0,sStack_220.v[8],modinfo_00);
      psVar94->v[8] = sStack_1a0.v[8];
      *(undefined8 *)(psVar94->v + 4) = sStack_1a0.v._16_8_;
      *(undefined8 *)(psVar94->v + 6) = sStack_1a0.v._24_8_;
      *(undefined8 *)psVar94->v = sStack_1a0.v._0_8_;
      *(undefined8 *)(psVar94->v + 2) = sStack_1a0.v._8_8_;
      return;
    }
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156e30;
    iVar38 = secp256k1_modinv32_mul_cmp_30(&sStack_220,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar38 == 0) goto LAB_00156eaf;
    uVar57 = 9;
    uVar83 = 0;
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156e4a;
    psVar90 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar38 == 0) {
      psVar90 = &sStack_1a0;
      uVar57 = 9;
      uVar83 = 0;
      psStack_248 = (secp256k1_modinv32_signed30 *)0x156e6d;
      iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar38 == 0) {
        psStack_248 = (secp256k1_modinv32_signed30 *)0x156e8c;
        iVar38 = secp256k1_modinv32_mul_cmp_30(&sStack_220,9,&modinfo_00->modulus,1);
        if (iVar38 == 0) goto LAB_00156eaf;
        psVar90 = &sStack_220;
        uVar57 = 9;
        uVar83 = 0xffffffff;
        psStack_248 = (secp256k1_modinv32_signed30 *)0x156ea7;
        iVar38 = secp256k1_modinv32_mul_cmp_30(psVar90,9,&modinfo_00->modulus,-1);
        if (iVar38 == 0) goto LAB_00156eaf;
      }
    }
  }
  else {
LAB_00156f3a:
    psStack_248 = (secp256k1_modinv32_signed30 *)0x156f3f;
    secp256k1_modinv32_cold_6();
  }
  psStack_248 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  psVar68 = &sStack_298;
  piVar59 = (int *)(ulong)uVar83;
  pcStack_2a0 = (code *)0x156f64;
  psStack_250 = psVar58;
  psStack_248 = psVar94;
  secp256k1_modinv32_mul_30(&sStack_274,psVar90,uVar57,1);
  pcStack_2a0 = (code *)0x156f76;
  piVar84 = piVar59;
  psVar94 = a;
  secp256k1_modinv32_mul_30(&sStack_298,a,9,uVar83);
  lVar41 = 0;
  while ((uint)sStack_274.v[lVar41] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_298.v[lVar41]) goto LAB_00156fc8;
    lVar41 = lVar41 + 1;
    if (lVar41 == 8) {
      uVar83 = 8;
      while( true ) {
        if (sStack_274.v[uVar83] < sStack_298.v[uVar83]) {
          return;
        }
        if (sStack_298.v[uVar83] < sStack_274.v[uVar83]) break;
        bVar100 = uVar83 == 0;
        uVar83 = uVar83 - 1;
        if (bVar100) {
          return;
        }
      }
      return;
    }
  }
  pcStack_2a0 = (code *)0x156fc8;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00156fc8:
  pcStack_2a0 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar38 = (int)psVar68;
  piStack_2c8 = piVar59;
  psStack_2c0 = modinfo_00;
  uStack_2b8 = uVar91;
  uStack_2a8 = uVar97;
  pcStack_2a0 = (code *)puVar62;
  if (iVar38 < 1) {
    psStack_2d8 = (secp256k1_modinv32_signed30 *)0x1570bb;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_001570bb:
    iVar44 = (int)piVar84;
    psStack_2d8 = (secp256k1_modinv32_signed30 *)0x1570c0;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar43 = piVar84[1];
    iVar1 = *piVar84;
    piVar59 = (int *)(long)psVar94->v[0];
    uVar45 = (long)*extraout_RDX * (long)iVar43 + (long)piVar59 * (long)iVar1;
    if ((uVar45 & 0x3fffffff) != 0) goto LAB_001570bb;
    iVar2 = piVar84[3];
    iVar44 = piVar84[2];
    piVar59 = (int *)((long)piVar59 * (long)iVar44);
    piVar84 = (int *)((long)*extraout_RDX * (long)iVar2 + (long)piVar59);
    if (((ulong)piVar84 & 0x3fffffff) == 0) {
      lVar46 = (long)piVar84 >> 0x1e;
      lVar41 = (long)uVar45 >> 0x1e;
      if (iVar38 != 1) {
        uVar97 = 1;
        do {
          lVar41 = (long)extraout_RDX[uVar97] * (long)iVar43 +
                   (long)psVar94->v[uVar97] * (long)iVar1 + lVar41;
          lVar46 = (long)extraout_RDX[uVar97] * (long)iVar2 +
                   (long)psVar94->v[uVar97] * (long)iVar44 + lVar46;
          psVar94->v[uVar97 - 1] = (uint)lVar41 & 0x3fffffff;
          extraout_RDX[uVar97 - 1] = (uint)lVar46 & 0x3fffffff;
          uVar97 = uVar97 + 1;
          lVar46 = lVar46 >> 0x1e;
          lVar41 = lVar41 >> 0x1e;
        } while (((ulong)psVar68 & 0xffffffff) != uVar97);
      }
      psVar94->v[(long)iVar38 + -1] = (int32_t)lVar41;
      extraout_RDX[(long)iVar38 + -1] = (int)lVar46;
      return;
    }
  }
  psStack_2d8 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar41 = 0;
  psStack_2d8 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar41 < extraout_EDX) {
      psStack_2d8 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_2d8->v + (long)psVar94->v[lVar41] * (long)iVar44);
    }
    psVar68->v[lVar41] = (uint)psStack_2d8 & 0x3fffffff;
    psStack_2d8 = (secp256k1_modinv32_signed30 *)((long)psStack_2d8 >> 0x1e);
    lVar41 = lVar41 + 1;
  } while (lVar41 != 8);
  if (8 < extraout_EDX) {
    psStack_2d8 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_2d8->v + (long)psVar94->v[8] * (long)iVar44);
  }
  psVar58 = (secp256k1_modinv32_signed30 *)(long)(int)psStack_2d8;
  if (psVar58 == psStack_2d8) {
    psVar68->v[8] = (int)psStack_2d8;
    return;
  }
  pcStack_2e0 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar83 = *extraout_RDX_00;
  psVar92 = (secp256k1_modinv32_signed30 *)(long)(int)uVar83;
  uVar48 = extraout_RDX_00[1];
  lVar41 = (long)(int)uVar48;
  uVar72 = extraout_RDX_00[2];
  psVar90 = (secp256k1_modinv32_signed30 *)(long)(int)uVar72;
  lStack_318 = (long)(int)extraout_RDX_00[3];
  psVar65 = (secp256k1_fe *)0x9;
  pcStack_328 = (code *)0x15715a;
  psVar69 = psVar68;
  piStack_308 = piVar59;
  psStack_300 = modinfo_00;
  uStack_2f8 = uVar91;
  uStack_2e8 = uVar97;
  pcStack_2e0 = (code *)puVar62;
  iVar38 = secp256k1_modinv32_mul_cmp_30(psVar68,9,psVar58,-2);
  if (iVar38 < 1) {
    pcStack_328 = (code *)0x1573c2;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_001573c2:
    pcStack_328 = (code *)0x1573c7;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_001573c7:
    pcStack_328 = (code *)0x1573cc;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_001573cc:
    pcStack_328 = (code *)0x1573d1;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_001573d1:
    pcStack_328 = (code *)0x1573d6;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001573d6:
    pcStack_328 = (code *)0x1573db;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001573db:
    pcStack_328 = (code *)0x1573e0;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001573e0:
    pcStack_328 = (code *)0x1573e5;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar87 = psVar58;
LAB_001573e5:
    pcStack_328 = (code *)0x1573ea;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001573ea:
    pcStack_328 = (code *)0x1573ef;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001573ef:
    pcStack_328 = (code *)0x1573f4;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x157177;
    psVar69 = psVar68;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar68,9,psVar58,1);
    if (-1 < iVar38) goto LAB_001573c2;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x157194;
    psVar69 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,9,psVar58,-2);
    if (iVar38 < 1) goto LAB_001573c7;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x1571b1;
    psVar69 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,9,psVar58,1);
    if (-1 < iVar38) goto LAB_001573cc;
    psVar87 = (secp256k1_modinv32_signed30 *)-(long)psVar92;
    if (0 < (long)psVar92) {
      psVar87 = psVar92;
    }
    lVar46 = -lVar41;
    if (lVar41 < 1) {
      lVar46 = lVar41;
    }
    if (lVar46 + 0x40000000 < (long)psVar87) goto LAB_001573d1;
    psVar87 = (secp256k1_modinv32_signed30 *)-(long)psVar90;
    if (0 < (long)psVar90) {
      psVar87 = psVar90;
    }
    lVar46 = -lStack_318;
    if (lStack_318 < 1) {
      lVar46 = lStack_318;
    }
    if (lVar46 + 0x40000000 < (long)psVar87) goto LAB_001573d6;
    uVar56 = psVar68->v[8] >> 0x1f;
    uVar47 = psVar94->v[8] >> 0x1f;
    psVar65 = (secp256k1_fe *)(ulong)uVar47;
    iVar38 = (uVar47 & uVar48) + (uVar56 & uVar83);
    psVar69 = (secp256k1_modinv32_signed30 *)
              (psVar94->v[0] * lVar41 + (long)psVar68->v[0] * (long)psVar92);
    lVar46 = (long)(int)(iVar38 - ((int)psVar69 * psVar58[1].v[0] + iVar38 & 0x3fffffffU));
    piVar49 = (int32_t *)((long)psVar69->v + lVar46 * psVar58->v[0]);
    if (((ulong)piVar49 & 0x3fffffff) != 0) goto LAB_001573db;
    lStack_310 = lVar46;
    iVar38 = (uVar47 & (uint)lStack_318) + (uVar56 & uVar72);
    lVar64 = psVar94->v[0] * lStack_318 + (long)psVar68->v[0] * (long)psVar90;
    psVar69 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar83 = iVar38 - (psVar58[1].v[0] * (int)lVar64 + iVar38 & 0x3fffffffU);
    psVar65 = (secp256k1_fe *)(ulong)uVar83;
    uVar97 = (long)psVar58->v[0] * (long)(int)uVar83 + lVar64;
    if ((uVar97 & 0x3fffffff) != 0) goto LAB_001573e0;
    lVar64 = (long)uVar97 >> 0x1e;
    lVar50 = (long)piVar49 >> 0x1e;
    lVar70 = 1;
    do {
      lVar50 = psVar58->v[lVar70] * lVar46 + psVar94->v[lVar70] * lVar41 +
               (long)psVar68->v[lVar70] * (long)psVar92 + lVar50;
      psVar87 = (secp256k1_modinv32_signed30 *)(psVar94->v[lVar70] * lStack_318);
      lVar64 = (long)psVar87->v +
               (long)psVar68->v[lVar70] * (long)psVar90 + lVar64 +
               (long)psVar58->v[lVar70] * (long)(int)uVar83;
      psVar68->v[lVar70 + -1] = (uint)lVar50 & 0x3fffffff;
      psVar94->v[lVar70 + -1] = (uint)lVar64 & 0x3fffffff;
      lVar70 = lVar70 + 1;
      lVar64 = lVar64 >> 0x1e;
      lVar50 = lVar50 >> 0x1e;
    } while (lVar70 != 9);
    psVar68->v[8] = (int32_t)lVar50;
    psVar94->v[8] = (int32_t)lVar64;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x15735b;
    psVar69 = psVar68;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar68,9,psVar58,-2);
    psVar90 = psVar94;
    psVar92 = psVar58;
    if (iVar38 < 1) goto LAB_001573e5;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x157378;
    psVar69 = psVar68;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar68,9,psVar58,1);
    if (-1 < iVar38) goto LAB_001573ea;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x157391;
    psVar69 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,9,psVar58,-2);
    if (iVar38 < 1) goto LAB_001573ef;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_328 = (code *)0x1573aa;
    psVar69 = psVar94;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar94,9,psVar58,1);
    if (iVar38 < 0) {
      return;
    }
  }
  pcStack_328 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_328 = (code *)lVar41;
  psStack_330 = psVar68;
  psStack_338 = psVar94;
  psStack_340 = psVar92;
  psStack_348 = psVar87;
  psStack_350 = psVar90;
  uVar83 = psVar69->v[0];
  uVar66 = (ulong)uVar83;
  uVar48 = psVar69->v[3];
  uVar40 = (ulong)uVar48;
  uVar72 = psVar69->v[4];
  uVar45 = (ulong)uVar72;
  uVar47 = psVar69->v[5];
  uVar91 = (ulong)uVar47;
  psVar94 = (secp256k1_modinv32_signed30 *)(ulong)(uint)psVar69->v[6];
  uVar56 = psVar69->v[7];
  uVar97 = (ulong)uVar56;
  iStack_354 = psVar69->v[8];
  lVar41 = 0;
  do {
    if (psVar69->v[lVar41] < -0x3fffffff) {
      pcStack_390 = (code *)0x157742;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00157742:
      pcStack_390 = (code *)0x157747;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00157747;
    }
    if (0x3fffffff < psVar69->v[lVar41]) goto LAB_00157742;
    lVar41 = lVar41 + 1;
  } while (lVar41 != 9);
  uStack_374 = (uint)psVar65;
  psVar65 = (secp256k1_fe *)0x9;
  pcStack_390 = (code *)0x15747f;
  psVar94 = psVar69;
  uStack_380 = psVar69->v[1];
  uStack_37c = psVar69->v[2];
  uStack_378 = psVar69->v[6];
  psStack_370 = b;
  iVar38 = secp256k1_modinv32_mul_cmp_30(psVar69,9,b,-2);
  if (iVar38 < 1) {
LAB_00157747:
    pcStack_390 = (code *)0x15774c;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015774c:
    pcStack_390 = (code *)0x157751;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_00157751:
    pcStack_390 = (code *)0x157756;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00157756:
    pcStack_390 = (code *)0x15775b;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_390 = (code *)0x15749e;
    psVar94 = psVar69;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar69,9,psStack_370,1);
    if (-1 < iVar38) goto LAB_0015774c;
    uVar89 = iStack_354 >> 0x1f;
    uStack_358 = psStack_370->v[1];
    uVar57 = (uVar89 & uStack_358) + uStack_380;
    uStack_380 = psStack_370->v[2];
    uVar93 = (uVar89 & uStack_380) + uStack_37c;
    uStack_37c = psStack_370->v[3];
    uStack_35c = psStack_370->v[4];
    uStack_360 = psStack_370->v[5];
    uStack_364 = psStack_370->v[6];
    uVar95 = (uVar89 & uStack_364) + uStack_378;
    uStack_378 = psStack_370->v[7];
    uStack_384 = (int)uStack_374 >> 0x1f;
    uStack_374 = psStack_370->v[8];
    uVar75 = ((uVar89 & psStack_370->v[0]) + uVar83 ^ uStack_384) - uStack_384;
    uVar61 = ((int)uVar75 >> 0x1e) + ((uVar57 ^ uStack_384) - uStack_384);
    uVar57 = ((int)uVar61 >> 0x1e) + ((uVar93 ^ uStack_384) - uStack_384);
    uVar96 = ((int)uVar57 >> 0x1e) + (((uVar89 & uStack_37c) + uVar48 ^ uStack_384) - uStack_384);
    uVar48 = ((int)uVar96 >> 0x1e) + (((uVar89 & uStack_35c) + uVar72 ^ uStack_384) - uStack_384);
    uVar83 = ((int)uVar48 >> 0x1e) + (((uVar89 & uStack_360) + uVar47 ^ uStack_384) - uStack_384);
    uVar72 = ((int)uVar83 >> 0x1e) + ((uVar95 ^ uStack_384) - uStack_384);
    uVar47 = ((int)uVar72 >> 0x1e) + (((uVar89 & uStack_378) + uVar56 ^ uStack_384) - uStack_384);
    uVar85 = ((int)uVar47 >> 0x1e) +
             (((uVar89 & uStack_374) + iStack_354 ^ uStack_384) - uStack_384);
    uVar91 = (ulong)uVar85;
    uStack_388 = (int)uVar85 >> 0x1f;
    uVar95 = (psStack_370->v[0] & uStack_388) + (uVar75 & 0x3fffffff);
    uVar93 = (uStack_360 & uStack_388) + (uVar83 & 0x3fffffff);
    uVar66 = (ulong)uVar93;
    uVar75 = (uStack_364 & uStack_388) + (uVar72 & 0x3fffffff);
    uVar40 = (ulong)uVar75;
    uVar83 = ((int)uVar95 >> 0x1e) + (uStack_358 & uStack_388) + (uVar61 & 0x3fffffff);
    uVar72 = ((int)uVar83 >> 0x1e) + (uStack_380 & uStack_388) + (uVar57 & 0x3fffffff);
    uVar56 = ((int)uVar72 >> 0x1e) + (uStack_37c & uStack_388) + (uVar96 & 0x3fffffff);
    uVar89 = ((int)uVar56 >> 0x1e) + (uStack_35c & uStack_388) + (uVar48 & 0x3fffffff);
    uVar93 = ((int)uVar89 >> 0x1e) + uVar93;
    uVar75 = ((int)uVar93 >> 0x1e) + uVar75;
    uVar48 = ((int)uVar75 >> 0x1e) + (uStack_378 & uStack_388) + (uVar47 & 0x3fffffff);
    uVar47 = ((int)uVar48 >> 0x1e) + (uStack_374 & uStack_388) + uVar85;
    uVar45 = (ulong)uVar47;
    uVar56 = uVar56 & 0x3fffffff;
    psVar65 = (secp256k1_fe *)(ulong)uVar56;
    uVar89 = uVar89 & 0x3fffffff;
    psVar94 = (secp256k1_modinv32_signed30 *)(ulong)uVar89;
    uVar48 = uVar48 & 0x3fffffff;
    uVar97 = (ulong)uVar48;
    psVar69->v[0] = uVar95 & 0x3fffffff;
    psVar69->v[1] = uVar83 & 0x3fffffff;
    psVar69->v[2] = uVar72 & 0x3fffffff;
    psVar69->v[3] = uVar56;
    psVar69->v[4] = uVar89;
    psVar69->v[5] = uVar93 & 0x3fffffff;
    psVar69->v[6] = uVar75 & 0x3fffffff;
    psVar69->v[7] = uVar48;
    psVar69->v[8] = uVar47;
    if (0x3fffffff < uVar47) goto LAB_00157751;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_390 = (code *)0x15770f;
    psVar94 = psVar69;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar69,9,psStack_370,0);
    if (iVar38 < 0) goto LAB_00157756;
    psVar65 = (secp256k1_fe *)0x9;
    pcStack_390 = (code *)0x15772a;
    psVar94 = psVar69;
    iVar38 = secp256k1_modinv32_mul_cmp_30(psVar69,9,psStack_370,1);
    if (iVar38 < 0) {
      return;
    }
  }
  pcStack_390 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  a_00 = &sStack_450;
  psVar60 = &sStack_450;
  pcVar88 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar88 = secp256k1_fe_inv;
  }
  pcStack_458 = (code *)0x157791;
  uStack_3b8 = uVar97;
  uStack_3b0 = uVar91;
  uStack_3a8 = uVar40;
  psStack_3a0 = psVar69;
  uStack_398 = uVar66;
  pcStack_390 = (code *)uVar45;
  (*pcVar88)(&sStack_450);
  if (psVar94 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar94->v + 8) = sStack_450.n[4];
    *(ulong *)(psVar94[1].v + 1) = CONCAT44(sStack_450.normalized,sStack_450.magnitude);
    *(uint64_t *)(psVar94->v + 4) = sStack_450.n[2];
    *(uint64_t *)(psVar94->v + 6) = sStack_450.n[3];
    *(uint64_t *)psVar94->v = sStack_450.n[0];
    *(uint64_t *)(psVar94->v + 2) = sStack_450.n[1];
  }
  uVar91 = 0xffffffffffff;
  sStack_3f0.n[0] = psVar65->n[0];
  sStack_3f0.n[1] = psVar65->n[1];
  sStack_3f0.n[2] = psVar65->n[2];
  sStack_3f0.n[3] = psVar65->n[3];
  sStack_3f0.n[4] = psVar65->n[4];
  sStack_3f0.magnitude = psVar65->magnitude;
  sStack_3f0.normalized = psVar65->normalized;
  psVar67 = &sStack_3f0;
  pcStack_458 = (code *)0x1577fa;
  secp256k1_fe_verify(psVar67);
  uVar97 = 0x1000003d1;
  uVar45 = (sStack_3f0.n[4] >> 0x30) * 0x1000003d1 + sStack_3f0.n[0];
  if (((uVar45 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar45 & 0xfffffffffffff) == 0)) {
    uVar40 = (uVar45 >> 0x34) + sStack_3f0.n[1];
    uVar66 = (uVar40 >> 0x34) + sStack_3f0.n[2];
    uVar71 = (uVar66 >> 0x34) + sStack_3f0.n[3];
    uVar73 = (uVar71 >> 0x34) + (sStack_3f0.n[4] & 0xffffffffffff);
    if ((((uVar40 | uVar45 | uVar66 | uVar71) & 0xfffffffffffff) != 0 || uVar73 != 0) &&
       (((uVar45 | 0x1000003d0) & uVar40 & uVar66 & uVar71 & (uVar73 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_001578a1;
LAB_00157c6b:
    pcStack_458 = (code *)0x157c76;
    secp256k1_fe_verify(&sStack_450);
    uVar91 = sStack_450.n[4] & 0xffffffffffff;
    uVar45 = (sStack_450.n[4] >> 0x30) * 0x1000003d1 + sStack_450.n[0];
    uVar40 = (uVar45 >> 0x34) + sStack_450.n[1];
    uVar66 = (uVar40 >> 0x34) + sStack_450.n[2];
    a_00 = (secp256k1_fe *)((uVar66 >> 0x34) + sStack_450.n[3]);
    uVar71 = ((ulong)a_00 >> 0x34) + uVar91;
    if ((((uVar40 | uVar45 | uVar66 | (ulong)a_00) & 0xfffffffffffff) == 0 && uVar71 == 0) ||
       (r = (secp256k1_fe *)(uVar71 ^ 0xf000000000000), psVar60 = &sStack_450,
       ((uVar45 ^ 0x1000003d0) & uVar40 & uVar66 & (ulong)a_00 & (ulong)r) == 0xfffffffffffff)) {
      return;
    }
  }
  else {
LAB_001578a1:
    pcStack_458 = (code *)0x1578b4;
    psVar67 = psVar65;
    secp256k1_fe_mul(&sStack_3f0,psVar65,&sStack_450);
    pcStack_458 = (code *)0x1578bc;
    secp256k1_fe_verify(&sStack_3f0);
    r = &fe_minus_one;
    pcStack_458 = (code *)0x1578c8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_3f0.magnitude < 0x20) {
      sStack_3f0.n[0] = sStack_3f0.n[0] + 0xffffefffffc2e;
      sStack_3f0.n[1] = sStack_3f0.n[1] + 0xfffffffffffff;
      sStack_3f0.n[2] = sStack_3f0.n[2] + 0xfffffffffffff;
      sStack_3f0.n[3] = sStack_3f0.n[3] + 0xfffffffffffff;
      sStack_3f0.n[4] = sStack_3f0.n[4] + 0xffffffffffff;
      sStack_3f0.normalized = 0;
      sStack_3f0.magnitude = sStack_3f0.magnitude + 1;
      pcStack_458 = (code *)0x15791a;
      secp256k1_fe_verify(&sStack_3f0);
      pcStack_458 = (code *)0x157922;
      secp256k1_fe_verify(&sStack_3f0);
      uVar45 = (sStack_3f0.n[4] >> 0x30) * 0x1000003d1 + sStack_3f0.n[0];
      uVar40 = (uVar45 >> 0x34) + sStack_3f0.n[1];
      uVar66 = (uVar40 >> 0x34) + sStack_3f0.n[2];
      psVar67 = (secp256k1_fe *)((uVar66 >> 0x34) + sStack_3f0.n[3]);
      uVar71 = ((ulong)psVar67 >> 0x34) + (sStack_3f0.n[4] & 0xffffffffffff);
      if ((((uVar40 | uVar45 | uVar66 | (ulong)psVar67) & 0xfffffffffffff) != 0 || uVar71 != 0) &&
         (r = (secp256k1_fe *)(uVar71 ^ 0xf000000000000),
         ((uVar45 ^ 0x1000003d0) & uVar40 & uVar66 & (ulong)psVar67 & (ulong)r) != 0xfffffffffffff))
      goto LAB_00157d09;
      sStack_420.n[0] = psVar65->n[0];
      sStack_420.n[1] = psVar65->n[1];
      sStack_420.n[2] = psVar65->n[2];
      sStack_420.n[3] = psVar65->n[3];
      sStack_420.n[4] = psVar65->n[4];
      sStack_420.magnitude = psVar65->magnitude;
      sStack_420.normalized = psVar65->normalized;
      psVar65 = &sStack_420;
      pcStack_458 = (code *)0x1579c8;
      secp256k1_fe_verify(psVar65);
      r = &fe_minus_one;
      pcStack_458 = (code *)0x1579d4;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_420.magnitude) goto LAB_00157d0e;
      sStack_420.n[0] = sStack_420.n[0] + 0xffffefffffc2e;
      sStack_420.n[1] = sStack_420.n[1] + 0xfffffffffffff;
      sStack_420.n[2] = sStack_420.n[2] + 0xfffffffffffff;
      sStack_420.n[3] = sStack_420.n[3] + 0xfffffffffffff;
      sStack_420.n[4] = sStack_420.n[4] + 0xffffffffffff;
      sStack_420.normalized = 0;
      sStack_420.magnitude = sStack_420.magnitude + 1;
      pcStack_458 = (code *)0x157a1f;
      secp256k1_fe_verify(&sStack_420);
      pcStack_458 = (code *)0x157a27;
      secp256k1_fe_verify(&sStack_420);
      uVar45 = (sStack_420.n[4] >> 0x30) * 0x1000003d1 + sStack_420.n[0];
      if (((uVar45 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar45 & 0xfffffffffffff) == 0)) {
        uVar40 = (uVar45 >> 0x34) + sStack_420.n[1];
        uVar66 = (uVar40 >> 0x34) + sStack_420.n[2];
        uVar71 = (uVar66 >> 0x34) + sStack_420.n[3];
        uVar73 = (uVar71 >> 0x34) + (sStack_420.n[4] & 0xffffffffffff);
        if (((uVar40 | uVar45 | uVar66 | uVar71) & 0xfffffffffffff) == 0 && uVar73 == 0) {
          return;
        }
        if (((uVar45 | 0x1000003d0) & uVar40 & uVar66 & uVar71 & (uVar73 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      psVar67 = &sStack_420;
      pcStack_458 = (code *)0x157ad6;
      (*pcVar88)();
      pcStack_458 = (code *)0x157ae1;
      secp256k1_fe_verify(&sStack_450);
      r = &fe_minus_one;
      pcStack_458 = (code *)0x157aed;
      secp256k1_fe_verify(&fe_minus_one);
      psVar65 = &sStack_450;
      if (0x1f < sStack_450.magnitude) goto LAB_00157d13;
      sStack_450.n[0] = sStack_450.n[0] + 0xffffefffffc2e;
      sStack_450.n[1] = sStack_450.n[1] + 0xfffffffffffff;
      sStack_450.n[2] = sStack_450.n[2] + 0xfffffffffffff;
      sStack_450.n[3] = sStack_450.n[3] + 0xfffffffffffff;
      sStack_450.n[4] = sStack_450.n[4] + 0xffffffffffff;
      sStack_450.magnitude = sStack_450.magnitude + 1;
      sStack_450.normalized = 0;
      pcStack_458 = (code *)0x157b36;
      secp256k1_fe_verify(&sStack_450);
      pcStack_458 = (code *)0x157b3f;
      (*pcVar88)(&sStack_450);
      pcStack_458 = (code *)0x157b47;
      secp256k1_fe_verify(&sStack_450);
      sStack_450.n[0] = sStack_450.n[0] + 1;
      sStack_450.magnitude = sStack_450.magnitude + 1;
      sStack_450.normalized = 0;
      pcStack_458 = (code *)0x157b59;
      secp256k1_fe_verify(&sStack_450);
      pcStack_458 = (code *)0x157b61;
      secp256k1_fe_verify(&sStack_450);
      psVar67 = &sStack_420;
      pcStack_458 = (code *)0x157b6e;
      r = psVar67;
      secp256k1_fe_verify(psVar67);
      if (sStack_420.magnitude + sStack_450.magnitude < 0x21) {
        sStack_450.n[0] = sStack_450.n[0] + sStack_420.n[0];
        sStack_450.n[1] = sStack_450.n[1] + sStack_420.n[1];
        sStack_450.n[2] = sStack_450.n[2] + sStack_420.n[2];
        sStack_450.n[3] = sStack_450.n[3] + sStack_420.n[3];
        sStack_450.n[4] = sStack_450.n[4] + sStack_420.n[4];
        sStack_450.normalized = 0;
        pcStack_458 = (code *)0x157bba;
        sStack_450.magnitude = sStack_420.magnitude + sStack_450.magnitude;
        secp256k1_fe_verify(&sStack_450);
        pcStack_458 = (code *)0x157bc2;
        secp256k1_fe_verify(&sStack_450);
        uVar45 = (sStack_450.n[4] >> 0x30) * 0x1000003d1 + sStack_450.n[0];
        if (((uVar45 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar45 & 0xfffffffffffff) == 0)) {
          uVar91 = (uVar45 >> 0x34) + sStack_450.n[1];
          uVar40 = (uVar91 >> 0x34) + sStack_450.n[2];
          uVar66 = (uVar40 >> 0x34) + sStack_450.n[3];
          uVar71 = (uVar66 >> 0x34) + (sStack_450.n[4] & 0xffffffffffff);
          if (((uVar91 | uVar45 | uVar40 | uVar66) & 0xfffffffffffff) == 0 && uVar71 == 0) {
            return;
          }
          if (((uVar45 | 0x1000003d0) & uVar91 & uVar40 & uVar66 & (uVar71 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_458 = (code *)0x157c6b;
        test_inverse_field_cold_2();
        goto LAB_00157c6b;
      }
    }
    else {
      pcStack_458 = (code *)0x157d09;
      test_inverse_field_cold_7();
LAB_00157d09:
      pcStack_458 = (code *)0x157d0e;
      test_inverse_field_cold_6();
LAB_00157d0e:
      pcStack_458 = (code *)0x157d13;
      test_inverse_field_cold_5();
LAB_00157d13:
      a_00 = psVar67;
      psVar60 = psVar65;
      psVar67 = &sStack_3f0;
      pcStack_458 = (code *)0x157d18;
      test_inverse_field_cold_4();
    }
    pcStack_458 = (code *)0x157d1d;
    test_inverse_field_cold_3();
  }
  pcStack_458 = test_inverse_scalar;
  test_inverse_field_cold_1();
  uStack_460 = 0xfffffffffffff;
  uStack_470 = 0x1000003d1;
  pcVar98 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar98 = secp256k1_scalar_inverse;
  }
  psVar65 = (secp256k1_fe *)auStack_508;
  psStack_520 = (secp256k1_fe *)0x157d58;
  r_00 = psVar65;
  auStack_4a0._32_8_ = psVar60;
  auStack_4a0._40_8_ = pcVar88;
  psStack_468 = psVar67;
  pcStack_458 = (code *)uVar91;
  uVar39 = (*pcVar98)();
  if (r != (secp256k1_fe *)0x0) {
    r->n[2] = CONCAT44(auStack_508._20_4_,auStack_508._16_4_);
    r->n[3] = CONCAT44(auStack_508._28_4_,auStack_508._24_4_);
    r->n[0] = CONCAT44(auStack_508._4_4_,auStack_508._0_4_);
    r->n[1] = CONCAT44(auStack_508._12_4_,auStack_508._8_4_);
  }
  uVar48 = 0;
  uVar72 = 0;
  uVar47 = 0;
  uVar56 = 0;
  auVar102._0_4_ = -(uint)((int)a_00->n[2] == 0 && (int)a_00->n[0] == 0);
  auVar102._4_4_ = -(uint)(*(int *)((long)a_00->n + 0x14) == 0 && *(int *)((long)a_00->n + 4) == 0);
  auVar102._8_4_ = -(uint)((int)a_00->n[3] == 0 && (int)a_00->n[1] == 0);
  auVar102._12_4_ =
       -(uint)(*(int *)((long)a_00->n + 0x1c) == 0 && *(int *)((long)a_00->n + 0xc) == 0);
  uVar83 = movmskps(uVar39,auVar102);
  uVar83 = uVar83 ^ 0xf;
  if (uVar83 != 0) {
    uVar45 = a_00->n[0];
    uVar91 = a_00->n[1];
    uVar40 = a_00->n[2];
    uVar55 = CONCAT44(auStack_508._4_4_,auStack_508._0_4_);
    pcVar88 = (code *)CONCAT44(auStack_508._12_4_,auStack_508._8_4_);
    uVar97 = CONCAT44(auStack_508._20_4_,auStack_508._16_4_);
    r = (secp256k1_fe *)CONCAT44(auStack_508._28_4_,auStack_508._24_4_);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar45;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar55;
    uVar51 = SUB168(auVar3 * auVar19,8);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar51;
    sStack_4e8.n[0] = SUB168(auVar3 * auVar19,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar45;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = pcVar88;
    auVar4 = auVar4 * auVar20;
    uVar74 = SUB168(auVar4 + auVar37,0);
    uVar76 = SUB168(auVar4 + auVar37,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar91;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar55;
    uVar52 = SUB168(auVar5 * auVar21,8);
    uVar73 = SUB168(auVar5 * auVar21,0);
    uVar66 = (ulong)CARRY8(uVar74,uVar73);
    uVar71 = uVar76 + uVar52;
    uVar77 = uVar71 + uVar66;
    uVar79 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar51,auVar4._0_8_)) +
             (ulong)(CARRY8(uVar76,uVar52) || CARRY8(uVar71,uVar66));
    sStack_4e8.n[1] = uVar74 + uVar73;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar45;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar97;
    uVar53 = SUB168(auVar6 * auVar22,8);
    uVar66 = SUB168(auVar6 * auVar22,0);
    uVar73 = uVar77 + uVar66;
    uVar66 = (ulong)CARRY8(uVar77,uVar66);
    uVar51 = uVar79 + uVar53;
    uVar80 = uVar51 + uVar66;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar91;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = pcVar88;
    uVar77 = SUB168(auVar7 * auVar23,8);
    uVar71 = SUB168(auVar7 * auVar23,0);
    uVar78 = uVar73 + uVar71;
    uVar71 = (ulong)CARRY8(uVar73,uVar71);
    uVar52 = uVar80 + uVar77;
    uVar81 = uVar52 + uVar71;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar40;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar55;
    uVar54 = SUB168(auVar8 * auVar24,8);
    uVar76 = SUB168(auVar8 * auVar24,0);
    uVar73 = (ulong)CARRY8(uVar78,uVar76);
    uVar74 = uVar81 + uVar54;
    uVar82 = uVar74 + uVar73;
    uVar79 = (ulong)(CARRY8(uVar79,uVar53) || CARRY8(uVar51,uVar66)) +
             (ulong)(CARRY8(uVar80,uVar77) || CARRY8(uVar52,uVar71)) +
             (ulong)(CARRY8(uVar81,uVar54) || CARRY8(uVar74,uVar73));
    sStack_4e8.n[2] = uVar78 + uVar76;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar45;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = r;
    uVar76 = SUB168(auVar9 * auVar25,8);
    uVar45 = SUB168(auVar9 * auVar25,0);
    uVar71 = uVar82 + uVar45;
    uVar45 = (ulong)CARRY8(uVar82,uVar45);
    uVar51 = uVar79 + uVar76;
    uVar78 = uVar51 + uVar45;
    pcVar99 = (code *)a_00->n[3];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar91;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar97;
    uVar53 = SUB168(auVar10 * auVar26,8);
    uVar66 = SUB168(auVar10 * auVar26,0);
    uVar73 = uVar71 + uVar66;
    uVar66 = (ulong)CARRY8(uVar71,uVar66);
    uVar52 = uVar78 + uVar53;
    uVar80 = uVar52 + uVar66;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar40;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = pcVar88;
    uVar77 = SUB168(auVar11 * auVar27,8);
    uVar71 = SUB168(auVar11 * auVar27,0);
    uVar82 = uVar73 + uVar71;
    uVar71 = (ulong)CARRY8(uVar73,uVar71);
    uVar74 = uVar80 + uVar77;
    uVar81 = uVar74 + uVar71;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = pcVar99;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar55;
    uVar54 = SUB168(auVar12 * auVar28,8);
    uVar73 = SUB168(auVar12 * auVar28,0);
    sStack_4e8.n[3] = uVar82 + uVar73;
    uVar73 = (ulong)CARRY8(uVar82,uVar73);
    uVar55 = uVar81 + uVar54;
    uVar82 = uVar55 + uVar73;
    uVar76 = (ulong)(CARRY8(uVar79,uVar76) || CARRY8(uVar51,uVar45)) +
             (ulong)(CARRY8(uVar78,uVar53) || CARRY8(uVar52,uVar66)) +
             (ulong)(CARRY8(uVar80,uVar77) || CARRY8(uVar74,uVar71)) +
             (ulong)(CARRY8(uVar81,uVar54) || CARRY8(uVar55,uVar73));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar91;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = r;
    uVar52 = SUB168(auVar13 * auVar29,8);
    uVar45 = SUB168(auVar13 * auVar29,0);
    uVar66 = uVar82 + uVar45;
    uVar45 = (ulong)CARRY8(uVar82,uVar45);
    uVar71 = uVar76 + uVar52;
    uVar53 = uVar71 + uVar45;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar40;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar97;
    uVar74 = SUB168(auVar14 * auVar30,8);
    uVar91 = SUB168(auVar14 * auVar30,0);
    uVar51 = uVar66 + uVar91;
    uVar91 = (ulong)CARRY8(uVar66,uVar91);
    uVar73 = uVar53 + uVar74;
    uVar77 = uVar73 + uVar91;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = pcVar99;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = pcVar88;
    uVar55 = SUB168(auVar15 * auVar31,8);
    uVar66 = SUB168(auVar15 * auVar31,0);
    sStack_4e8.n[4] = uVar51 + uVar66;
    uVar66 = (ulong)CARRY8(uVar51,uVar66);
    uVar51 = uVar77 + uVar55;
    uVar54 = uVar51 + uVar66;
    uVar51 = (ulong)(CARRY8(uVar76,uVar52) || CARRY8(uVar71,uVar45)) +
             (ulong)(CARRY8(uVar53,uVar74) || CARRY8(uVar73,uVar91)) +
             (ulong)(CARRY8(uVar77,uVar55) || CARRY8(uVar51,uVar66));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar40;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = r;
    uVar71 = SUB168(auVar16 * auVar32,8);
    uVar45 = SUB168(auVar16 * auVar32,0);
    uVar66 = uVar54 + uVar45;
    uVar45 = (ulong)CARRY8(uVar54,uVar45);
    uVar40 = uVar51 + uVar71;
    uVar52 = uVar40 + uVar45;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pcVar99;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar97;
    uVar73 = SUB168(auVar17 * auVar33,8);
    uVar91 = SUB168(auVar17 * auVar33,0);
    sStack_4e8._40_8_ = uVar66 + uVar91;
    uVar91 = (ulong)CARRY8(uVar66,uVar91);
    uVar66 = uVar52 + uVar73;
    auStack_4b8._8_8_ =
         (ulong)(CARRY8(uVar51,uVar71) || CARRY8(uVar40,uVar45)) +
         (ulong)(CARRY8(uVar52,uVar73) || CARRY8(uVar66,uVar91));
    auStack_4b8._0_8_ = uVar66 + uVar91;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = pcVar99;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = r;
    auStack_4b8 = auVar18 * auVar34 + auStack_4b8;
    psVar65 = (secp256k1_fe *)auStack_4a0;
    psStack_520 = (secp256k1_fe *)0x157ef3;
    r_00 = psVar65;
    pcStack_510 = pcVar98;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)psVar65,(uint64_t *)(auStack_508 + 0x20));
    if (((auStack_4a0._0_8_ != 1 || auStack_4a0._8_8_ != 0) || auStack_4a0._16_8_ != 0) ||
        auStack_4a0._24_8_ != 0) {
      psStack_520 = (secp256k1_fe *)0x157fea;
      test_inverse_scalar_cold_1();
      goto LAB_00157fea;
    }
    psStack_520 = (secp256k1_fe *)0x157f23;
    iVar38 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_508 + 0x20),(secp256k1_scalar *)a_00,
                        &scalar_minus_one);
    pcVar98 = pcStack_510;
    auVar101._0_4_ = -(uint)((int)sStack_4e8.n[2] == 0 && (int)sStack_4e8.n[0] == 0);
    auVar101._4_4_ = -(uint)(sStack_4e8.n[2]._4_4_ == 0 && sStack_4e8.n[0]._4_4_ == 0);
    auVar101._8_4_ = -(uint)((int)sStack_4e8.n[3] == 0 && (int)sStack_4e8.n[1] == 0);
    auVar101._12_4_ = -(uint)(sStack_4e8.n[3]._4_4_ == 0 && sStack_4e8.n[1]._4_4_ == 0);
    iVar38 = movmskps(iVar38,auVar101);
    if (iVar38 == 0xf) {
      return;
    }
    psVar65 = (secp256k1_fe *)(auStack_508 + 0x20);
    psStack_520 = (secp256k1_fe *)0x157f53;
    (*pcStack_510)(psVar65,psVar65);
    r = (secp256k1_fe *)auStack_508;
    psStack_520 = (secp256k1_fe *)0x157f6a;
    secp256k1_scalar_add((secp256k1_scalar *)r,&scalar_minus_one,(secp256k1_scalar *)r);
    psStack_520 = (secp256k1_fe *)0x157f73;
    (*pcVar98)(r,r);
    psStack_520 = (secp256k1_fe *)0x157f85;
    secp256k1_scalar_add((secp256k1_scalar *)r,(secp256k1_scalar *)r,&secp256k1_scalar_one);
    psStack_520 = (secp256k1_fe *)0x157f93;
    r_00 = r;
    iVar38 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r,(secp256k1_scalar *)psVar65,(secp256k1_scalar *)r);
    auVar103._0_4_ = -(uint)(auStack_508._16_4_ == 0 && auStack_508._0_4_ == 0);
    auVar103._4_4_ = -(uint)(auStack_508._20_4_ == 0 && auStack_508._4_4_ == 0);
    auVar103._8_4_ = -(uint)(auStack_508._24_4_ == 0 && auStack_508._8_4_ == 0);
    auVar103._12_4_ = -(uint)(auStack_508._28_4_ == 0 && auStack_508._12_4_ == 0);
    iVar38 = movmskps(iVar38,auVar103);
    if (iVar38 == 0xf) {
      return;
    }
    psStack_520 = (secp256k1_fe *)0x157fb7;
    test_inverse_scalar_cold_2();
    uVar83 = extraout_EAX;
    uVar48 = extraout_XMM0_Da;
    uVar72 = extraout_XMM0_Db;
    uVar47 = extraout_XMM0_Dc;
    uVar56 = extraout_XMM0_Dd;
  }
  auVar104._0_4_ = -(uint)((auStack_508._16_4_ | auStack_508._0_4_) == uVar48);
  auVar104._4_4_ = -(uint)((auStack_508._20_4_ | auStack_508._4_4_) == uVar72);
  auVar104._8_4_ = -(uint)((auStack_508._24_4_ | auStack_508._8_4_) == uVar47);
  auVar104._12_4_ = -(uint)((auStack_508._28_4_ | auStack_508._12_4_) == uVar56);
  iVar38 = movmskps(uVar83,auVar104);
  pcVar99 = pcVar98;
  if (iVar38 == 0xf) {
    return;
  }
LAB_00157fea:
  psStack_520 = (secp256k1_fe *)random_fe;
  test_inverse_scalar_cold_3();
  psStack_548 = psVar65;
  pcStack_540 = pcVar88;
  uStack_538 = uVar97;
  psStack_530 = r;
  pcStack_528 = pcVar99;
  psStack_520 = a_00;
  do {
    secp256k1_testrand256(auStack_570);
    secp256k1_fe_impl_set_b32_mod(r_00,auStack_570);
    bVar35 = (r_00->n[2] & r_00->n[3] & r_00->n[1]) == 0xfffffffffffff;
    bVar36 = r_00->n[4] == 0xffffffffffff;
    bVar100 = 0xffffefffffc2e < r_00->n[0];
    if (bVar100 && (bVar35 && bVar36)) {
      r_00->magnitude = -1;
    }
    else {
      r_00->magnitude = 1;
      r_00->normalized = 1;
      secp256k1_fe_verify(r_00);
    }
  } while (bVar100 && (bVar35 && bVar36));
  return;
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }
#ifdef VERIFY
        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}